

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TagInfoDatabase.cpp
# Opt level: O3

string * __thiscall
TagInfoDatabase::toJson_abi_cxx11_(string *__return_storage_ptr__,TagInfoDatabase *this)

{
  string *psVar1;
  bool bVar2;
  ostream *poVar3;
  _Base_ptr p_Var4;
  bool bVar5;
  char *pcVar6;
  _Rb_tree_header *p_Var7;
  TagInfo tagInfo;
  stringstream json;
  TagInfo local_204;
  string local_200;
  string local_1e0;
  string *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"{",1);
  p_Var4 = (this->_tagInformation)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var7 = &(this->_tagInformation)._M_t._M_impl.super__Rb_tree_header;
  local_1c0 = __return_storage_ptr__;
  if ((_Rb_tree_header *)p_Var4 != p_Var7) {
    bVar5 = true;
    do {
      local_204._count = p_Var4[2]._M_color;
      bVar2 = TagInfo::hasCount(&local_204);
      if (bVar2) {
        pcVar6 = ",";
        if (bVar5) {
          pcVar6 = "";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,pcVar6,(ulong)((byte)~bVar5 & 1));
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n  \"",4);
        ::json::encode(&local_1e0,(string *)(p_Var4 + 1));
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\":",2);
        TagInfo::toJson_abi_cxx11_(&local_200,&local_204);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,local_200._M_dataplus._M_p,local_200._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != &local_200.field_2) {
          operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
          operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
        }
        bVar5 = false;
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var7);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n}",2);
  psVar1 = local_1c0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar1;
}

Assistant:

std::string TagInfoDatabase::toJson ()
{
  std::stringstream json;
  bool first = true;

  json << "{";

  for (auto& pair : _tagInformation)
  {
    auto tagInfo = pair.second;

    if (tagInfo.hasCount ())
    {
      json << (first ? "" : ",")
         << "\n  \"" << json::encode (pair.first) << "\":"
         << tagInfo.toJson ();

      first = (first ? false : first);
    }
  }

  json << "\n}";

  return json.str ();
}